

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTimestamp.cxx
# Opt level: O2

string * __thiscall
cmTimestamp::AddTimestampComponent_abi_cxx11_
          (string *__return_storage_ptr__,cmTimestamp *this,char flag,tm *timeStruct,time_t timeT,
          bool utcFlag,uint32_t microseconds)

{
  int iVar1;
  uint uVar2;
  size_t sVar4;
  time_t __time0;
  undefined7 in_register_00000011;
  string *__return_storage_ptr___00;
  double dVar5;
  allocator<char> local_b9;
  string formatString;
  undefined1 local_98 [48];
  char buffer [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  char local_48 [16];
  char *local_38;
  ulong uVar3;
  
  buffer._8_8_ = &local_58;
  buffer[0] = '\x01';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  local_58._M_local_buf[0] = 0x25;
  local_98._0_8_ = (char *)0x1;
  __return_storage_ptr___00 = &formatString;
  local_98._8_8_ = local_98 + 0x10;
  local_98[0x10] = flag;
  cmStrCat<>(__return_storage_ptr___00,(cmAlphaNum *)buffer,(cmAlphaNum *)local_98);
  iVar1 = (int)CONCAT71(in_register_00000011,flag);
  uVar2 = iVar1 - 0x41;
  uVar3 = (ulong)uVar2;
  if (uVar2 < 0x3a) {
    if ((0x340120b03341183U >> (uVar3 & 0x3f) & 1) == 0) {
      if (uVar3 == 0x25) {
        std::__cxx11::to_string((string *)buffer,microseconds % 1000000);
        local_98._0_8_ = local_98 + 0x10;
        std::__cxx11::string::_M_construct((ulong)local_98,'\x06' - (char)buffer._8_8_);
        std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer)
        ;
        std::__cxx11::string::~string((string *)local_98);
        std::__cxx11::string::~string((string *)buffer);
        goto LAB_0027db8a;
      }
      if (uVar3 == 0x32) {
        buffer[0] = '\0';
        buffer[1] = '\0';
        buffer[2] = '\0';
        buffer[3] = '\0';
        buffer[4] = '\0';
        buffer[5] = '\0';
        buffer[6] = '\0';
        buffer[7] = '\0';
        local_38 = (char *)0x0;
        local_58._8_8_ = 0;
        local_48[0] = '\0';
        local_48[1] = '\0';
        local_48[2] = '\0';
        local_48[3] = '\0';
        local_48[4] = '\0';
        local_48[5] = '\0';
        local_48[6] = '\0';
        local_48[7] = '\0';
        local_48[8] = '\0';
        local_48[9] = '\0';
        local_48[10] = '\0';
        local_48[0xb] = '\0';
        local_48[0xc] = '\0';
        local_48[0xd] = '\0';
        local_48[0xe] = '\0';
        local_48[0xf] = '\0';
        buffer[8] = '\0';
        buffer[9] = '\0';
        buffer[10] = '\0';
        buffer[0xb] = '\0';
        buffer[0xc] = '\x01';
        buffer[0xd] = '\0';
        buffer[0xe] = '\0';
        buffer[0xf] = '\0';
        local_58._M_allocated_capacity = 0x4600000000;
        __time0 = CreateUtcTimeTFromTm((cmTimestamp *)__return_storage_ptr___00,(tm *)buffer);
        if (__time0 == -1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_98,
                     "Error generating UNIX epoch in string(TIMESTAMP ...) or file(TIMESTAMP ...). Please, file a bug report against CMake"
                     ,&local_b9);
          cmSystemTools::Error((string *)local_98);
          std::__cxx11::string::~string((string *)local_98);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        }
        else {
          dVar5 = difftime(timeT,__time0);
          std::__cxx11::to_string(__return_storage_ptr__,(long)dVar5);
        }
        goto LAB_0027db8a;
      }
      goto LAB_0027dc0e;
    }
  }
  else {
LAB_0027dc0e:
    if (iVar1 != 0x25) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)formatString._M_dataplus._M_p == &formatString.field_2) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(formatString.field_2._M_allocated_capacity._1_7_,
                      formatString.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = formatString.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = formatString._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(formatString.field_2._M_allocated_capacity._1_7_,
                      formatString.field_2._M_local_buf[0]);
      }
      __return_storage_ptr__->_M_string_length = formatString._M_string_length;
      formatString._M_string_length = 0;
      formatString.field_2._M_local_buf[0] = '\0';
      formatString._M_dataplus._M_p = (pointer)&formatString.field_2;
      goto LAB_0027db8a;
    }
  }
  sVar4 = strftime(buffer,0x10,formatString._M_dataplus._M_p,(tm *)timeStruct);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,buffer,buffer + sVar4);
LAB_0027db8a:
  std::__cxx11::string::~string((string *)&formatString);
  return __return_storage_ptr__;
}

Assistant:

std::string cmTimestamp::AddTimestampComponent(
  char flag, struct tm& timeStruct, const time_t timeT, const bool utcFlag,
  const uint32_t microseconds) const
{
  std::string formatString = cmStrCat('%', flag);

  switch (flag) {
    case 'a':
    case 'A':
    case 'b':
    case 'B':
    case 'd':
    case 'H':
    case 'I':
    case 'j':
    case 'm':
    case 'M':
    case 'S':
    case 'U':
    case 'V':
    case 'w':
    case 'y':
    case 'Y':
    case '%':
      break;
    case 'Z':
#if defined(__GLIBC__)
      // 'struct tm' has the time zone, so strftime can honor UTC.
      static_cast<void>(utcFlag);
#else
      // 'struct tm' may not have the time zone, so strftime may
      // use local time.  Hard-code the UTC result.
      if (utcFlag) {
        return std::string("GMT");
      }
#endif
      break;
    case 'z': {
#if defined(__GLIBC__)
      // 'struct tm' has the time zone, so strftime can honor UTC.
      static_cast<void>(utcFlag);
#else
      // 'struct tm' may not have the time zone, so strftime may
      // use local time.  Hard-code the UTC result.
      if (utcFlag) {
        return std::string("+0000");
      }
#endif
#ifndef _AIX
      break;
#else
      std::string xpg_sus_old;
      bool const xpg_sus_was_set =
        cmSystemTools::GetEnv("XPG_SUS_ENV", xpg_sus_old);
      if (xpg_sus_was_set && xpg_sus_old == "ON") {
        break;
      }
      xpg_sus_old = "XPG_SUS_ENV=" + xpg_sus_old;

      // On AIX systems, %z requires XPG_SUS_ENV=ON to work as desired.
      cmSystemTools::PutEnv("XPG_SUS_ENV=ON");
      tzset();

      char buffer[16];
      size_t size = strftime(buffer, sizeof(buffer), "%z", &timeStruct);

#  ifndef CMAKE_BOOTSTRAP
      if (xpg_sus_was_set) {
        cmSystemTools::PutEnv(xpg_sus_old);
      } else {
        cmSystemTools::UnsetEnv("XPG_SUS_ENV");
      }
#  else
      // No UnsetEnv during bootstrap.  This is good enough for CMake itself.
      cmSystemTools::PutEnv(xpg_sus_old);
      static_cast<void>(xpg_sus_was_set);
#  endif
      tzset();

      return std::string(buffer, size);
#endif
    }
    case 's': // Seconds since UNIX epoch (midnight 1-jan-1970)
    {
      // Build a time_t for UNIX epoch and subtract from the input "timeT":
      struct tm tmUnixEpoch;
      memset(&tmUnixEpoch, 0, sizeof(tmUnixEpoch));
      tmUnixEpoch.tm_mday = 1;
      tmUnixEpoch.tm_year = 1970 - 1900;

      const time_t unixEpoch = this->CreateUtcTimeTFromTm(tmUnixEpoch);
      if (unixEpoch == -1) {
        cmSystemTools::Error(
          "Error generating UNIX epoch in string(TIMESTAMP ...) or "
          "file(TIMESTAMP ...). Please, file a bug report against CMake");
        return std::string();
      }

      return std::to_string(static_cast<long int>(difftime(timeT, unixEpoch)));
    }
    case 'f': // microseconds
    {
      // clip number to 6 digits and pad with leading zeros
      std::string microsecs = std::to_string(microseconds % 1000000);
      return std::string(6 - microsecs.length(), '0') + microsecs;
    }
    default: {
      return formatString;
    }
  }

  char buffer[16];

#ifdef __MINGW32__
  /* See a bug in MinGW: https://sourceforge.net/p/mingw-w64/bugs/793/. A work
   * around is to try to use strftime() from ucrtbase.dll. */
  using T = size_t(__cdecl*)(char*, size_t, const char*, const struct tm*);
  auto loadUcrtStrftime = []() -> T {
    auto handle =
      LoadLibraryExA("ucrtbase.dll", nullptr, LOAD_LIBRARY_SEARCH_SYSTEM32);
    if (handle) {
#  pragma GCC diagnostic push
#  pragma GCC diagnostic ignored "-Wcast-function-type"
      return reinterpret_cast<T>(GetProcAddress(handle, "strftime"));
#  pragma GCC diagnostic pop
    }
    return nullptr;
  };
  static T ucrtStrftime = loadUcrtStrftime();

  if (ucrtStrftime) {
    size_t size =
      ucrtStrftime(buffer, sizeof(buffer), formatString.c_str(), &timeStruct);
    return std::string(buffer, size);
  }
#endif

  size_t size =
    strftime(buffer, sizeof(buffer), formatString.c_str(), &timeStruct);

  return std::string(buffer, size);
}